

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_asn1.cc
# Opt level: O1

int DSA_marshal_private_key(CBB *cbb,DSA *dsa)

{
  int iVar1;
  CBB child;
  CBB local_40;
  
  iVar1 = CBB_add_asn1(cbb,&local_40,0x20000010);
  if (((((iVar1 != 0) && (iVar1 = CBB_add_asn1_uint64(&local_40,0), iVar1 != 0)) &&
       (iVar1 = marshal_integer(&local_40,dsa->p), iVar1 != 0)) &&
      ((iVar1 = marshal_integer(&local_40,dsa->q), iVar1 != 0 &&
       (iVar1 = marshal_integer(&local_40,dsa->g), iVar1 != 0)))) &&
     ((iVar1 = marshal_integer(&local_40,dsa->pub_key), iVar1 != 0 &&
      ((iVar1 = marshal_integer(&local_40,dsa->priv_key), iVar1 != 0 &&
       (iVar1 = CBB_flush(cbb), iVar1 != 0)))))) {
    return 1;
  }
  ERR_put_error(10,0,0x6a,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa_asn1.cc"
                ,0xfb);
  return 0;
}

Assistant:

int DSA_marshal_private_key(CBB *cbb, const DSA *dsa) {
  CBB child;
  if (!CBB_add_asn1(cbb, &child, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_uint64(&child, 0 /* version */) ||
      !marshal_integer(&child, dsa->p) ||
      !marshal_integer(&child, dsa->q) ||
      !marshal_integer(&child, dsa->g) ||
      !marshal_integer(&child, dsa->pub_key) ||
      !marshal_integer(&child, dsa->priv_key) ||
      !CBB_flush(cbb)) {
    OPENSSL_PUT_ERROR(DSA, DSA_R_ENCODE_ERROR);
    return 0;
  }
  return 1;
}